

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018cef0 = 0x2d2d2d2d2d2d2d;
    uRam000000000018cef7._0_1_ = '-';
    uRam000000000018cef7._1_1_ = '-';
    uRam000000000018cef7._2_1_ = '-';
    uRam000000000018cef7._3_1_ = '-';
    uRam000000000018cef7._4_1_ = '-';
    uRam000000000018cef7._5_1_ = '-';
    uRam000000000018cef7._6_1_ = '-';
    uRam000000000018cef7._7_1_ = '-';
    DAT_0018cee0 = '-';
    DAT_0018cee0_1._0_1_ = '-';
    DAT_0018cee0_1._1_1_ = '-';
    DAT_0018cee0_1._2_1_ = '-';
    DAT_0018cee0_1._3_1_ = '-';
    DAT_0018cee0_1._4_1_ = '-';
    DAT_0018cee0_1._5_1_ = '-';
    DAT_0018cee0_1._6_1_ = '-';
    uRam000000000018cee8 = 0x2d2d2d2d2d2d2d;
    DAT_0018ceef = 0x2d;
    DAT_0018ced0 = '-';
    DAT_0018ced0_1._0_1_ = '-';
    DAT_0018ced0_1._1_1_ = '-';
    DAT_0018ced0_1._2_1_ = '-';
    DAT_0018ced0_1._3_1_ = '-';
    DAT_0018ced0_1._4_1_ = '-';
    DAT_0018ced0_1._5_1_ = '-';
    DAT_0018ced0_1._6_1_ = '-';
    uRam000000000018ced8._0_1_ = '-';
    uRam000000000018ced8._1_1_ = '-';
    uRam000000000018ced8._2_1_ = '-';
    uRam000000000018ced8._3_1_ = '-';
    uRam000000000018ced8._4_1_ = '-';
    uRam000000000018ced8._5_1_ = '-';
    uRam000000000018ced8._6_1_ = '-';
    uRam000000000018ced8._7_1_ = '-';
    DAT_0018cec0 = '-';
    DAT_0018cec0_1._0_1_ = '-';
    DAT_0018cec0_1._1_1_ = '-';
    DAT_0018cec0_1._2_1_ = '-';
    DAT_0018cec0_1._3_1_ = '-';
    DAT_0018cec0_1._4_1_ = '-';
    DAT_0018cec0_1._5_1_ = '-';
    DAT_0018cec0_1._6_1_ = '-';
    uRam000000000018cec8._0_1_ = '-';
    uRam000000000018cec8._1_1_ = '-';
    uRam000000000018cec8._2_1_ = '-';
    uRam000000000018cec8._3_1_ = '-';
    uRam000000000018cec8._4_1_ = '-';
    uRam000000000018cec8._5_1_ = '-';
    uRam000000000018cec8._6_1_ = '-';
    uRam000000000018cec8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000018ceb8._0_1_ = '-';
    uRam000000000018ceb8._1_1_ = '-';
    uRam000000000018ceb8._2_1_ = '-';
    uRam000000000018ceb8._3_1_ = '-';
    uRam000000000018ceb8._4_1_ = '-';
    uRam000000000018ceb8._5_1_ = '-';
    uRam000000000018ceb8._6_1_ = '-';
    uRam000000000018ceb8._7_1_ = '-';
    DAT_0018ceff = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}